

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.h
# Opt level: O2

void __thiscall chrono::fea::ChElementCableANCF::GetSubBlockOffset(ChElementCableANCF *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return nodes[nblock]->NodeGetOffset_w(); }